

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O2

void __thiscall
glslang::TPpContext::TokenizableIncludeFile::TokenizableIncludeFile
          (TokenizableIncludeFile *this,TSourceLoc *startLoc,string *prologue,
          IncludeResult *includedFile,string *epilogue,TPpContext *pp)

{
  TInputScanner *this_00;
  size_type sVar1;
  IncludeResult *pIVar2;
  pointer pcVar3;
  pointer filename;
  
  (this->super_tInput).done = false;
  (this->super_tInput).pp = pp;
  (this->super_tInput)._vptr_tInput = (_func_int **)&PTR__TokenizableIncludeFile_008a4018;
  std::__cxx11::string::string((string *)&this->prologue_,(string *)prologue);
  std::__cxx11::string::string((string *)&this->epilogue_,(string *)epilogue);
  this->includedFile_ = includedFile;
  this_00 = &this->scanner;
  TInputScanner::TInputScanner(this_00,3,this->strings,this->lengths,(char **)0x0,0,0,true);
  this->prevScanner = (TInputScanner *)0x0;
  (this->stringInput).super_tInput.done = false;
  (this->stringInput).super_tInput.pp = pp;
  (this->stringInput).super_tInput._vptr_tInput = (_func_int **)&PTR__tInput_0089b390;
  (this->stringInput).input = this_00;
  sVar1 = (this->prologue_)._M_string_length;
  this->strings[0] = (this->prologue_)._M_dataplus._M_p;
  pIVar2 = this->includedFile_;
  this->strings[1] = pIVar2->headerData;
  this->strings[2] = (this->epilogue_)._M_dataplus._M_p;
  this->lengths[0] = sVar1;
  this->lengths[1] = pIVar2->headerLength;
  this->lengths[2] = (this->epilogue_)._M_string_length;
  TInputScanner::setLine(this_00,startLoc->line);
  TInputScanner::setString(this_00,startLoc->string);
  filename = "";
  pcVar3 = "";
  if (startLoc->name != (TString *)0x0) {
    pcVar3 = (startLoc->name->_M_dataplus)._M_p;
  }
  TInputScanner::setFile(this_00,pcVar3,0);
  pcVar3 = "";
  if (startLoc->name != (TString *)0x0) {
    pcVar3 = (startLoc->name->_M_dataplus)._M_p;
  }
  TInputScanner::setFile(this_00,pcVar3,1);
  if (startLoc->name != (TString *)0x0) {
    filename = (startLoc->name->_M_dataplus)._M_p;
  }
  TInputScanner::setFile(this_00,filename,2);
  return;
}

Assistant:

TokenizableIncludeFile(const TSourceLoc& startLoc,
                          const std::string& prologue,
                          TShader::Includer::IncludeResult* includedFile,
                          const std::string& epilogue,
                          TPpContext* pp)
            : tInput(pp),
              prologue_(prologue),
              epilogue_(epilogue),
              includedFile_(includedFile),
              scanner(3, strings, lengths, nullptr, 0, 0, true),
              prevScanner(nullptr),
              stringInput(pp, scanner)
        {
              strings[0] = prologue_.data();
              strings[1] = includedFile_->headerData;
              strings[2] = epilogue_.data();

              lengths[0] = prologue_.size();
              lengths[1] = includedFile_->headerLength;
              lengths[2] = epilogue_.size();

              scanner.setLine(startLoc.line);
              scanner.setString(startLoc.string);

              scanner.setFile(startLoc.getFilenameStr(), 0);
              scanner.setFile(startLoc.getFilenameStr(), 1);
              scanner.setFile(startLoc.getFilenameStr(), 2);
        }